

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GGMTree.cpp
# Opt level: O1

vector<GGMNode,_std::allocator<GGMNode>_> * __thiscall
GGMTree::min_coverage
          (vector<GGMNode,_std::allocator<GGMNode>_> *__return_storage_ptr__,GGMTree *this,
          vector<GGMNode,_std::allocator<GGMNode>_> *node_list)

{
  pointer pGVar1;
  undefined8 uVar2;
  uint8_t uVar3;
  uint8_t uVar4;
  uint8_t uVar5;
  uint8_t uVar6;
  pointer pGVar7;
  long lVar8;
  ulong uVar9;
  pointer pGVar10;
  int iVar11;
  ulong uVar12;
  int iVar13;
  vector<GGMNode,_std::allocator<GGMNode>_> next_level_node;
  value_type node1;
  vector<GGMNode,_std::allocator<GGMNode>_> local_b8;
  GGMTree *local_98;
  vector<GGMNode,_std::allocator<GGMNode>_> local_90;
  GGMNode local_78;
  GGMNode local_58;
  
  local_b8.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.super__Vector_impl_data.
  _M_start = (GGMNode *)0x0;
  local_b8.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.super__Vector_impl_data.
  _M_finish = (GGMNode *)0x0;
  local_b8.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (GGMNode *)0x0;
  pGVar7 = (node_list->super__Vector_base<GGMNode,_std::allocator<GGMNode>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pGVar10 = (node_list->super__Vector_base<GGMNode,_std::allocator<GGMNode>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  lVar8 = (long)pGVar10 - (long)pGVar7;
  local_98 = this;
  if (lVar8 != 0) {
    uVar9 = lVar8 >> 5;
    uVar12 = 0;
    iVar13 = 0;
    do {
      pGVar10 = pGVar7 + uVar12;
      pGVar1 = pGVar7 + uVar12;
      local_58.index = pGVar1->index;
      local_58.level = pGVar1->level;
      local_58.key[0] = pGVar1->key[0];
      local_58.key[1] = pGVar1->key[1];
      local_58.key[2] = pGVar1->key[2];
      local_58.key[3] = pGVar1->key[3];
      local_58.key._4_8_ = *(undefined8 *)(pGVar7[uVar12].key + 4);
      local_58._24_8_ = *(undefined8 *)(pGVar7[uVar12].key + 4 + 8);
      iVar11 = iVar13 + 1;
      uVar12 = (ulong)iVar11;
      if (uVar9 == uVar12) {
        if (local_b8.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_b8.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<GGMNode,std::allocator<GGMNode>>::_M_realloc_insert<GGMNode&>
                    ((vector<GGMNode,std::allocator<GGMNode>> *)&local_b8,
                     (iterator)
                     local_b8.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.
                     super__Vector_impl_data._M_finish,&local_58);
          iVar11 = iVar13;
        }
        else {
LAB_001036e3:
          lVar8 = pGVar10->index;
          iVar11 = pGVar10->level;
          uVar3 = pGVar10->key[0];
          uVar4 = pGVar10->key[1];
          uVar5 = pGVar10->key[2];
          uVar6 = pGVar10->key[3];
          uVar2 = *(undefined8 *)(pGVar10->key + 0xc);
          *(undefined8 *)
           ((local_b8.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.
             super__Vector_impl_data._M_finish)->key + 4) = *(undefined8 *)(pGVar10->key + 4);
          *(undefined8 *)
           ((local_b8.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.
             super__Vector_impl_data._M_finish)->key + 0xc) = uVar2;
          (local_b8.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.
           super__Vector_impl_data._M_finish)->index = lVar8;
          (local_b8.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.
           super__Vector_impl_data._M_finish)->level = iVar11;
          (local_b8.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.
           super__Vector_impl_data._M_finish)->key[0] = uVar3;
          (local_b8.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.
           super__Vector_impl_data._M_finish)->key[1] = uVar4;
          (local_b8.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.
           super__Vector_impl_data._M_finish)->key[2] = uVar5;
          (local_b8.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.
           super__Vector_impl_data._M_finish)->key[3] = uVar6;
          local_b8.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_b8.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
          iVar11 = iVar13;
        }
      }
      else if (((ulong)(pGVar7[uVar12].index ^ local_58.index) < 2) &&
              (local_58.level == pGVar7[uVar12].level)) {
        local_78.index = local_58.index >> 1;
        local_78.level = local_58.level - 1;
        local_78.key[0] = '\0';
        local_78.key[1] = '\0';
        local_78.key[2] = '\0';
        local_78.key[3] = '\0';
        local_78.key[4] = '\0';
        local_78.key[5] = '\0';
        local_78.key[6] = '\0';
        local_78.key[7] = '\0';
        local_78.key[8] = '\0';
        local_78.key[9] = '\0';
        local_78.key[10] = '\0';
        local_78.key[0xb] = '\0';
        local_78.key[0xc] = '\0';
        local_78.key[0xd] = '\0';
        local_78.key[0xe] = '\0';
        local_78.key[0xf] = '\0';
        if (local_b8.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_b8.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<GGMNode,_std::allocator<GGMNode>_>::_M_realloc_insert<GGMNode>
                    (&local_b8,
                     (iterator)
                     local_b8.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.
                     super__Vector_impl_data._M_finish,&local_78);
        }
        else {
          uVar9 = (ulong)(uint)local_78.level;
          (local_b8.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.
           super__Vector_impl_data._M_finish)->key[4] = '\0';
          (local_b8.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.
           super__Vector_impl_data._M_finish)->key[5] = '\0';
          (local_b8.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.
           super__Vector_impl_data._M_finish)->key[6] = '\0';
          (local_b8.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.
           super__Vector_impl_data._M_finish)->key[7] = '\0';
          (local_b8.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.
           super__Vector_impl_data._M_finish)->key[8] = '\0';
          (local_b8.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.
           super__Vector_impl_data._M_finish)->key[9] = '\0';
          (local_b8.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.
           super__Vector_impl_data._M_finish)->key[10] = '\0';
          (local_b8.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.
           super__Vector_impl_data._M_finish)->key[0xb] = '\0';
          *(ulong *)((local_b8.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.
                      super__Vector_impl_data._M_finish)->key + 0xc) =
               (ulong)(uint)local_78._28_4_ << 0x20;
          (local_b8.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.
           super__Vector_impl_data._M_finish)->index = local_78.index;
          (local_b8.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.
           super__Vector_impl_data._M_finish)->level = (int)uVar9;
          (local_b8.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.
           super__Vector_impl_data._M_finish)->key[0] = (char)(uVar9 >> 0x20);
          (local_b8.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.
           super__Vector_impl_data._M_finish)->key[1] = (char)(uVar9 >> 0x28);
          (local_b8.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.
           super__Vector_impl_data._M_finish)->key[2] = (char)(uVar9 >> 0x30);
          (local_b8.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.
           super__Vector_impl_data._M_finish)->key[3] = (char)(uVar9 >> 0x38);
          local_b8.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_b8.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
      }
      else {
        if (local_b8.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            local_b8.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) goto LAB_001036e3;
        std::vector<GGMNode,std::allocator<GGMNode>>::_M_realloc_insert<GGMNode&>
                  ((vector<GGMNode,std::allocator<GGMNode>> *)&local_b8,
                   (iterator)
                   local_b8.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.
                   super__Vector_impl_data._M_finish,&local_58);
        iVar11 = iVar13;
      }
      iVar13 = iVar11 + 1;
      uVar12 = (ulong)iVar13;
      pGVar7 = (node_list->super__Vector_base<GGMNode,_std::allocator<GGMNode>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pGVar10 = (node_list->super__Vector_base<GGMNode,_std::allocator<GGMNode>_>)._M_impl.
                super__Vector_impl_data._M_finish;
      lVar8 = (long)pGVar10 - (long)pGVar7;
      uVar9 = lVar8 >> 5;
    } while (uVar12 < uVar9);
  }
  if ((local_b8.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.
       super__Vector_impl_data._M_finish ==
       local_b8.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.
       super__Vector_impl_data._M_start) ||
     ((long)local_b8.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_b8.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.
            super__Vector_impl_data._M_start == lVar8)) {
    (__return_storage_ptr__->super__Vector_base<GGMNode,_std::allocator<GGMNode>_>)._M_impl.
    super__Vector_impl_data._M_start = pGVar7;
    (__return_storage_ptr__->super__Vector_base<GGMNode,_std::allocator<GGMNode>_>)._M_impl.
    super__Vector_impl_data._M_finish = pGVar10;
    (__return_storage_ptr__->super__Vector_base<GGMNode,_std::allocator<GGMNode>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (node_list->super__Vector_base<GGMNode,_std::allocator<GGMNode>_>)._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    (node_list->super__Vector_base<GGMNode,_std::allocator<GGMNode>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (node_list->super__Vector_base<GGMNode,_std::allocator<GGMNode>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (node_list->super__Vector_base<GGMNode,_std::allocator<GGMNode>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    std::vector<GGMNode,_std::allocator<GGMNode>_>::vector(&local_90,&local_b8);
    min_coverage(__return_storage_ptr__,local_98,&local_90);
    if (local_90.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_90.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_90.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_90.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  if (local_b8.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.super__Vector_impl_data
      ._M_start != (GGMNode *)0x0) {
    operator_delete(local_b8.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_b8.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_b8.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<GGMNode> GGMTree::min_coverage(vector<GGMNode> node_list) {
    vector<GGMNode> next_level_node;

    for (int i = 0; i < node_list.size(); ++i) {
        auto node1 = node_list[i];

        if(i + 1 == node_list.size()) {
            next_level_node.emplace_back(node1);
        } else {
            auto node2 = node_list[i + 1];
            // same parent in the binary path
            if(((node1.index >> 1) == (node2.index >> 1)) && (node1.level == node2.level)) {
                next_level_node.emplace_back(GGMNode(node1.index >> 1, node1.level - 1));
                i++;
            } else {
                next_level_node.emplace_back(node1);
            }
        }
    }

    // no merge return
    if (next_level_node.size() == node_list.size() || next_level_node.empty()) {
        return node_list;
    }

    return min_coverage(next_level_node);
}